

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl
          (cmLinkedTree<cmStateDetail::PolicyStackEntry> *this,iterator it,PolicyStackEntry *t)

{
  pointer *ppPVar1;
  iterator __position;
  iterator __position_00;
  _WordT _Var2;
  _WordT _Var3;
  _WordT _Var4;
  _WordT _Var5;
  _WordT _Var6;
  _WordT _Var7;
  bool bVar8;
  undefined7 uVar9;
  ulong uVar10;
  iterator iVar11;
  ulong local_18;
  
  local_18 = it.Position;
  __position._M_current =
       (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  uVar10 = (long)__position._M_current -
           (long)(this->UpPositions).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if (uVar10 != (long)(this->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                  ,0xb4,
                  "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  if (local_18 <= uVar10) {
    if (__position._M_current ==
        (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->UpPositions,
                 __position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    __position_00._M_current =
         (this->Data).
         super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->Data).
        super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
      ::_M_realloc_insert<cmStateDetail::PolicyStackEntry>(&this->Data,__position_00,t);
    }
    else {
      _Var2 = (t->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[0];
      _Var3 = (t->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[1];
      _Var4 = (t->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[2];
      _Var5 = (t->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[3];
      _Var6 = (t->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[4];
      _Var7 = (t->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[5];
      bVar8 = t->Weak;
      uVar9 = *(undefined7 *)&t->field_0x39;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[6] =
           (t->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[6];
      (__position_00._M_current)->Weak = bVar8;
      *(undefined7 *)&(__position_00._M_current)->field_0x39 = uVar9;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[4] = _Var6;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[5] = _Var7;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[2] = _Var4;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[3] = _Var5;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[0] = _Var2;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<7UL>._M_w[1] = _Var3;
      ppPVar1 = &(this->Data).
                 super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    iVar11.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar11.Tree = this;
    return iVar11;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                ,0xb5,
                "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

iterator Push_impl(iterator it, T&& t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(std::move(t));
    return iterator(this, this->UpPositions.size());
  }